

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O0

TPZAutoPointer<TPZDohrAssembleItem<long_double>_> __thiscall
TPZDohrAssembleList<long_double>::PopItem(TPZDohrAssembleList<long_double> *this)

{
  bool bVar1;
  TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *in_RSI;
  TPZReference *in_RDI;
  lock_guard<std::mutex> lock;
  TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *result;
  mutex_type *in_stack_ffffffffffffff98;
  TPZReference *this_00;
  _Self local_40;
  _Self local_38 [4];
  byte local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::TPZAutoPointer(in_RSI);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff98);
  local_38[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
       ::begin((list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                *)in_stack_ffffffffffffff98);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
       ::end((list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
              *)in_stack_ffffffffffffff98);
  bVar1 = std::operator!=(local_38,&local_40);
  if (bVar1) {
    *(int *)&in_RSI->fRef = *(int *)&in_RSI->fRef + -1;
    std::__cxx11::
    list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
    ::begin((list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
             *)in_stack_ffffffffffffff98);
    std::_List_iterator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>::operator*
              ((_List_iterator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_> *)0x1fc8d5b);
    TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::operator=
              ((TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)this_00,
               (TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)in_RDI);
    std::__cxx11::
    list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
    ::pop_front((list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                 *)in_RDI);
  }
  local_11 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1fc8db6);
  if ((local_11 & 1) == 0) {
    TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)in_RDI);
  }
  return (TPZAutoPointer<TPZDohrAssembleItem<long_double>_>)this_00;
}

Assistant:

TPZAutoPointer<TPZDohrAssembleItem<TVar> > TPZDohrAssembleList<TVar>::PopItem()
{
	TPZAutoPointer<TPZDohrAssembleItem<TVar> > result;
    std::lock_guard<std::mutex> lock(fListAccessLock);
	if (fWork.begin() != fWork.end()) {
		fNumItems--;
		result = *fWork.begin();
		fWork.pop_front();
	}
	return result;
}